

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O0

int CVAhermiteGetY(CVodeMem cv_mem,sunrealtype t,N_Vector y,N_Vector *yS)

{
  int iVar1;
  long in_RDX;
  undefined8 in_RSI;
  CVodeMem in_RDI;
  sunrealtype in_XMM0_Qa;
  N_Vector *XXvecs [4];
  N_Vector Xvecs [4];
  sunrealtype cvals [4];
  int retval;
  int newpoint;
  long index;
  int NS;
  int is;
  int flag;
  N_Vector *ySd1;
  N_Vector *yS1;
  N_Vector *ySd0;
  N_Vector *yS0;
  N_Vector yd1;
  N_Vector y1;
  N_Vector yd0;
  N_Vector y0;
  sunrealtype factor3;
  sunrealtype factor2;
  sunrealtype factor1;
  sunrealtype delta;
  sunrealtype t1;
  sunrealtype t0;
  CVhermiteDataMem content1;
  CVhermiteDataMem content0;
  CVdtpntMem *dt_mem;
  CVadjMem ca_mem;
  int local_13c;
  undefined8 local_138;
  undefined8 local_130;
  N_Vector *local_128;
  N_Vector *local_120;
  undefined8 local_118;
  undefined8 local_110;
  N_Vector local_108;
  N_Vector local_100;
  undefined8 local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  int local_d8;
  int local_d4;
  long local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  CVdtpntMemRec **local_38;
  CVadjMemRec *local_30;
  long local_28;
  undefined8 local_20;
  sunrealtype local_18;
  CVodeMem local_10;
  int local_4;
  
  local_a0 = 0;
  local_a8 = 0;
  local_30 = in_RDI->cv_adj_mem;
  local_38 = local_30->dt_mem;
  if ((local_30->ca_IMinterpSensi == 0) || (in_RDX == 0)) {
    local_13c = 0;
  }
  else {
    local_13c = in_RDI->cv_Ns;
  }
  local_c4 = local_13c;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  local_10 = in_RDI;
  local_bc = CVAfindIndex(in_RDI,in_XMM0_Qa,&local_d0,&local_d4);
  local_4 = local_bc;
  if (local_bc == 0) {
    if (local_d0 == 0) {
      local_40 = (undefined8 *)(*local_38)->content;
      N_VScale(0x3ff0000000000000,*local_40,local_20);
      if (0 < local_c4) {
        for (local_c0 = 0; local_c0 < local_c4; local_c0 = local_c0 + 1) {
          local_10->cv_cvals[local_c0] = 1.0;
        }
        iVar1 = N_VScaleVectorArray(local_c4,local_10->cv_cvals,local_40[2],local_28);
        if (iVar1 != 0) {
          return -0x1c;
        }
      }
      local_4 = 0;
    }
    else {
      local_50 = local_38[local_d0 + -1]->t;
      local_58 = local_38[local_d0]->t;
      local_e8 = local_58 - local_50;
      local_40 = (undefined8 *)local_38[local_d0 + -1]->content;
      local_110 = *local_40;
      local_100 = (N_Vector)local_40[1];
      if (local_30->ca_IMinterpSensi != 0) {
        local_a0 = local_40[2];
        local_a8 = local_40[3];
      }
      local_88 = local_100;
      local_80 = local_110;
      local_60 = local_e8;
      if (local_d4 != 0) {
        local_48 = (undefined8 *)local_38[local_d0]->content;
        local_118 = *local_48;
        local_108 = (N_Vector)local_48[1];
        local_f8 = 0xc000000000000000;
        local_f0 = 2.0;
        local_e0 = local_e8;
        local_98 = local_108;
        local_90 = local_118;
        local_d8 = N_VLinearCombination(4,&local_f8,&local_118,local_30->ca_Y[1]);
        if (local_d8 != 0) {
          return -0x1c;
        }
        local_f8 = 0x3ff0000000000000;
        local_118 = local_90;
        local_f0 = -1.0;
        local_110 = local_80;
        local_e8 = -local_60;
        local_108 = (N_Vector)local_88;
        local_d8 = N_VLinearCombination(3,&local_f8,&local_118,local_30->ca_Y[0]);
        if (local_d8 != 0) {
          return -0x1c;
        }
        if (0 < local_c4) {
          local_138 = local_48[2];
          local_128 = (N_Vector *)local_48[3];
          local_f8 = 0xc000000000000000;
          local_f0 = 2.0;
          local_130 = local_a0;
          local_e8 = local_60;
          local_e0 = local_60;
          local_120 = (N_Vector *)local_a8;
          local_b8 = local_128;
          local_b0 = local_138;
          local_d8 = N_VLinearCombinationVectorArray
                               (local_c4,4,&local_f8,&local_138,local_30->ca_YS[1]);
          if (local_d8 != 0) {
            return -0x1c;
          }
          local_f8 = 0x3ff0000000000000;
          local_138 = local_b0;
          local_f0 = -1.0;
          local_130 = local_a0;
          local_e8 = -local_60;
          local_128 = (N_Vector *)local_a8;
          iVar1 = N_VLinearCombinationVectorArray
                            (local_c4,3,&local_f8,&local_138,local_30->ca_YS[0]);
          if (iVar1 != 0) {
            return -0x1c;
          }
        }
        local_d8 = 0;
      }
      local_f0 = local_18 - local_50;
      local_e8 = (local_f0 / local_60) * (local_f0 / local_60);
      local_e0 = (local_e8 * (local_18 - local_58)) / local_60;
      local_f8 = 0x3ff0000000000000;
      local_118 = local_80;
      local_110 = local_88;
      local_108 = local_30->ca_Y[0];
      local_100 = local_30->ca_Y[1];
      local_78 = local_e0;
      local_70 = local_e8;
      local_68 = local_f0;
      local_d8 = N_VLinearCombination(4,&local_f8,&local_118,local_20);
      if (local_d8 == 0) {
        if (0 < local_c4) {
          local_138 = local_a0;
          local_130 = local_a8;
          local_128 = local_30->ca_YS[0];
          local_120 = local_30->ca_YS[1];
          iVar1 = N_VLinearCombinationVectorArray(local_c4,4,&local_f8,&local_138,local_28);
          if (iVar1 != 0) {
            return -0x1c;
          }
        }
        local_4 = 0;
      }
      else {
        local_4 = -0x1c;
      }
    }
  }
  return local_4;
}

Assistant:

static int CVAhermiteGetY(CVodeMem cv_mem, sunrealtype t, N_Vector y, N_Vector* yS)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVhermiteDataMem content0, content1;

  sunrealtype t0, t1, delta;
  sunrealtype factor1, factor2, factor3;

  N_Vector y0, yd0, y1, yd1;
  N_Vector *yS0 = NULL, *ySd0 = NULL, *yS1, *ySd1;

  int flag, is, NS;
  long int index;
  sunbooleantype newpoint;

  /* local variables for fused vector oerations */
  int retval;
  sunrealtype cvals[4];
  N_Vector Xvecs[4];
  N_Vector* XXvecs[4];

  ca_mem = cv_mem->cv_adj_mem;
  dt_mem = ca_mem->dt_mem;

  /* Local value of Ns */

  NS = (ca_mem->ca_IMinterpSensi && (yS != NULL)) ? cv_mem->cv_Ns : 0;

  /* Get the index in dt_mem */

  flag = CVAfindIndex(cv_mem, t, &index, &newpoint);
  if (flag != CV_SUCCESS) { return (flag); }

  /* If we are beyond the left limit but close enough,
     then return y at the left limit. */

  if (index == 0)
  {
    content0 = (CVhermiteDataMem)(dt_mem[0]->content);
    N_VScale(ONE, content0->y, y);

    if (NS > 0)
    {
      for (is = 0; is < NS; is++) { cv_mem->cv_cvals[is] = ONE; }

      retval = N_VScaleVectorArray(NS, cv_mem->cv_cvals, content0->yS, yS);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
    }

    return (CV_SUCCESS);
  }

  /* Extract stuff from the appropriate data points */

  t0    = dt_mem[index - 1]->t;
  t1    = dt_mem[index]->t;
  delta = t1 - t0;

  content0 = (CVhermiteDataMem)(dt_mem[index - 1]->content);
  y0       = content0->y;
  yd0      = content0->yd;
  if (ca_mem->ca_IMinterpSensi)
  {
    yS0  = content0->yS;
    ySd0 = content0->ySd;
  }

  if (newpoint)
  {
    /* Recompute Y0 and Y1 */

    content1 = (CVhermiteDataMem)(dt_mem[index]->content);

    y1  = content1->y;
    yd1 = content1->yd;

    /* Y1 = delta (yd1 + yd0) - 2 (y1 - y0) */
    cvals[0] = -TWO;
    Xvecs[0] = y1;
    cvals[1] = TWO;
    Xvecs[1] = y0;
    cvals[2] = delta;
    Xvecs[2] = yd1;
    cvals[3] = delta;
    Xvecs[3] = yd0;

    retval = N_VLinearCombination(4, cvals, Xvecs, ca_mem->ca_Y[1]);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

    /* Y0 = y1 - y0 - delta * yd0 */
    cvals[0] = ONE;
    Xvecs[0] = y1;
    cvals[1] = -ONE;
    Xvecs[1] = y0;
    cvals[2] = -delta;
    Xvecs[2] = yd0;

    retval = N_VLinearCombination(3, cvals, Xvecs, ca_mem->ca_Y[0]);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

    /* Recompute YS0 and YS1, if needed */

    if (NS > 0)
    {
      yS1  = content1->yS;
      ySd1 = content1->ySd;

      /* YS1 = delta (ySd1 + ySd0) - 2 (yS1 - yS0) */
      cvals[0]  = -TWO;
      XXvecs[0] = yS1;
      cvals[1]  = TWO;
      XXvecs[1] = yS0;
      cvals[2]  = delta;
      XXvecs[2] = ySd1;
      cvals[3]  = delta;
      XXvecs[3] = ySd0;

      retval = N_VLinearCombinationVectorArray(NS, 4, cvals, XXvecs,
                                               ca_mem->ca_YS[1]);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

      /* YS0 = yS1 - yS0 - delta * ySd0 */
      cvals[0]  = ONE;
      XXvecs[0] = yS1;
      cvals[1]  = -ONE;
      XXvecs[1] = yS0;
      cvals[2]  = -delta;
      XXvecs[2] = ySd0;

      retval = N_VLinearCombinationVectorArray(NS, 3, cvals, XXvecs,
                                               ca_mem->ca_YS[0]);
      if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
    }
  }

  /* Perform the actual interpolation. */

  factor1 = t - t0;

  factor2 = factor1 / delta;
  factor2 = factor2 * factor2;

  factor3 = factor2 * (t - t1) / delta;

  cvals[0] = ONE;
  cvals[1] = factor1;
  cvals[2] = factor2;
  cvals[3] = factor3;

  /* y = y0 + factor1 yd0 + factor2 * Y[0] + factor3 Y[1] */
  Xvecs[0] = y0;
  Xvecs[1] = yd0;
  Xvecs[2] = ca_mem->ca_Y[0];
  Xvecs[3] = ca_mem->ca_Y[1];

  retval = N_VLinearCombination(4, cvals, Xvecs, y);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  /* yS = yS0 + factor1 ySd0 + factor2 * YS[0] + factor3 YS[1], if needed */
  if (NS > 0)
  {
    XXvecs[0] = yS0;
    XXvecs[1] = ySd0;
    XXvecs[2] = ca_mem->ca_YS[0];
    XXvecs[3] = ca_mem->ca_YS[1];

    retval = N_VLinearCombinationVectorArray(NS, 4, cvals, XXvecs, yS);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }
  }

  return (CV_SUCCESS);
}